

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorRegressor::MergeFrom
          (SupportVectorRegressor *this,SupportVectorRegressor *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  Kernel *this_00;
  Coefficients *this_01;
  SparseSupportVectors *this_02;
  SparseSupportVectors *from_00;
  DenseSupportVectors *this_03;
  DenseSupportVectors *from_01;
  Kernel *from_02;
  Coefficients *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/SVM.pb.cc"
               ,0xc7b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) &&
     (from->kernel_ != (Kernel *)0x0)) {
    this_00 = mutable_kernel(this);
    from_02 = from->kernel_;
    if (from_02 == (Kernel *)0x0) {
      from_02 = (Kernel *)&_Kernel_default_instance_;
    }
    Kernel::MergeFrom(this_00,from_02);
  }
  if ((from != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) &&
     (from->coefficients_ != (Coefficients *)0x0)) {
    this_01 = mutable_coefficients(this);
    from_03 = from->coefficients_;
    if (from_03 == (Coefficients *)0x0) {
      from_03 = (Coefficients *)&_Coefficients_default_instance_;
    }
    Coefficients::MergeFrom(this_01,from_03);
  }
  dVar1 = from->rho_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->rho_ = dVar1;
  }
  if (from->_oneof_case_[0] == 3) {
    this_03 = mutable_densesupportvectors(this);
    from_01 = densesupportvectors(from);
    DenseSupportVectors::MergeFrom(this_03,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    this_02 = mutable_sparsesupportvectors(this);
    from_00 = sparsesupportvectors(from);
    SparseSupportVectors::MergeFrom(this_02,from_00);
  }
  return;
}

Assistant:

void SupportVectorRegressor::MergeFrom(const SupportVectorRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SupportVectorRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_kernel()) {
    mutable_kernel()->::CoreML::Specification::Kernel::MergeFrom(from.kernel());
  }
  if (from.has_coefficients()) {
    mutable_coefficients()->::CoreML::Specification::Coefficients::MergeFrom(from.coefficients());
  }
  if (from.rho() != 0) {
    set_rho(from.rho());
  }
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
}